

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

LdElemInfo * __thiscall
Memory::AllocateArray<Memory::Recycler,Js::LdElemInfo,false>
          (Memory *this,Recycler *allocator,offset_in_Recycler_to_subr AllocFunc,size_t count)

{
  undefined1 auVar1 [16];
  LdElemInfo *pLVar2;
  size_t byteSize;
  LdElemInfo *this_00;
  
  if (count == 0) {
    Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
    pLVar2 = (LdElemInfo *)&DAT_00000008;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = count;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(6),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(6),0);
    }
    pLVar2 = (LdElemInfo *)
             new__<Memory::Recycler>
                       (byteSize,(Recycler *)this,(offset_in_Recycler_to_subr)allocator);
    this_00 = pLVar2;
    do {
      ValueType::ValueType(&this_00->arrayType);
      ValueType::ValueType(&this_00->elemType);
      this_00->flags = FldInfo_NoInfo;
      this_00->field_3 = (anon_union_1_2_471f577c_for_LdElemInfo_3)0x1;
      this_00 = this_00 + 1;
    } while (this_00 != pLVar2 + count);
  }
  return pLVar2;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}